

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

validator * __thiscall libchars::validation::get_validator_by_id(validation *this,id_t id)

{
  iterator iVar1;
  key_type local_14 [2];
  id_t id_local;
  
  if ((id != 0) &&
     (iVar1 = std::
              _Rb_tree<int,_std::pair<const_int,_const_libchars::validator_*>,_std::_Select1st<std::pair<const_int,_const_libchars::validator_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_libchars::validator_*>_>_>
              ::find(&(this->i2v)._M_t,local_14),
     (_Rb_tree_header *)iVar1._M_node != &(this->i2v)._M_t._M_impl.super__Rb_tree_header)) {
    return (validator *)iVar1._M_node[1]._M_parent;
  }
  return (validator *)0x0;
}

Assistant:

const validator *validation::get_validator_by_id(validator::id_t id)
    {
        if (id == validator::NONE)
            return NULL;

        validators_by_id_t::const_iterator ii = i2v.find(id);
        if (ii != i2v.end())
            return ii->second;
        else
            return NULL;
    }